

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool IR::Instr::HasSymUseInRange(StackSym *sym,Instr *instrBegin,Instr *instrEnd)

{
  Instr **ppIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  Instr *pIVar6;
  
  if (instrEnd == (Instr *)0x0) {
    pIVar6 = (Instr *)0x0;
  }
  else {
    pIVar6 = instrEnd->m_next;
  }
  if (pIVar6 == instrBegin) {
    bVar3 = false;
  }
  else {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIVar5 = (Instr *)0x0;
    do {
      if ((pIVar5 != (Instr *)0x0) && (pIVar5->m_next != instrBegin)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xc23,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar3) goto LAB_004b8fa9;
        *puVar4 = 0;
      }
      if (instrBegin == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xc25,"(instr)","instr");
        if (!bVar3) {
LAB_004b8fa9:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      bVar3 = HasSymUse(instrBegin,sym);
    } while ((!bVar3) &&
            (ppIVar1 = &instrBegin->m_next, pIVar5 = instrBegin, instrBegin = *ppIVar1,
            *ppIVar1 != pIVar6));
  }
  return bVar3;
}

Assistant:

FOREACH_INSTR_IN_RANGE(instr, instrBegin, instrEnd)
    {
        Assert(instr);
        if (instr->HasSymUse(sym))
        {
            return true;
        }
    }